

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::resize_bicubic(Mat *src,Mat *dst,int w,int h,Option *opt)

{
  Layer *pLVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  ParamDict pd;
  Layer *interp;
  int in_stack_fffffffffffff6cc;
  ParamDict *in_stack_fffffffffffff6d0;
  undefined1 local_928 [40];
  ParamDict *in_stack_fffffffffffff700;
  
  pLVar1 = create_layer(in_stack_fffffffffffff6cc);
  ParamDict::ParamDict(in_stack_fffffffffffff700);
  ParamDict::set((ParamDict *)local_928,0,3);
  ParamDict::set((ParamDict *)local_928,3,in_ECX);
  ParamDict::set((ParamDict *)local_928,4,in_EDX);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_928);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_R8);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(in_stack_fffffffffffff6d0);
  return;
}

Assistant:

void resize_bicubic(const Mat& src, Mat& dst, int w, int h, const Option& opt)
{
    ncnn::Layer* interp = ncnn::create_layer(ncnn::LayerType::Interp);

    ncnn::ParamDict pd;
    pd.set(0, 3);
    pd.set(3, h);
    pd.set(4, w);

    interp->load_param(pd);

    interp->forward(src, dst, opt);

    delete interp;
}